

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

bool __thiscall draco::ObjEncoder::ExitAndCleanup(ObjEncoder *this,bool return_value)

{
  this->sub_obj_att_ = (PointAttribute *)0x0;
  this->added_edges_att_ = (PointAttribute *)0x0;
  this->normal_att_ = (PointAttribute *)0x0;
  this->material_att_ = (PointAttribute *)0x0;
  this->pos_att_ = (PointAttribute *)0x0;
  this->tex_coord_att_ = (PointAttribute *)0x0;
  this->out_buffer_ = (EncoderBuffer *)0x0;
  this->in_point_cloud_ = (PointCloud *)0x0;
  this->in_mesh_ = (Mesh *)0x0;
  this->current_sub_obj_id_ = -1;
  this->current_material_id_ = -1;
  (this->file_name_)._M_string_length = 0;
  *(this->file_name_)._M_dataplus._M_p = '\0';
  return return_value;
}

Assistant:

bool ObjEncoder::ExitAndCleanup(bool return_value) {
  in_mesh_ = nullptr;
  in_point_cloud_ = nullptr;
  out_buffer_ = nullptr;
  pos_att_ = nullptr;
  tex_coord_att_ = nullptr;
  normal_att_ = nullptr;
  material_att_ = nullptr;
  sub_obj_att_ = nullptr;
  added_edges_att_ = nullptr;
  current_sub_obj_id_ = -1;
  current_material_id_ = -1;
  file_name_.clear();
  return return_value;
}